

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O0

ostream * Nova::Log::cout_Helper(void)

{
  int iVar1;
  basic_ostream<char,_std::char_traits<char>_> *object_input;
  streambuf *psVar2;
  
  if (cout_Helper()::helper == '\0') {
    iVar1 = __cxa_guard_acquire(&cout_Helper()::helper);
    if (iVar1 != 0) {
      object_input = (basic_ostream<char,_std::char_traits<char>_> *)operator_new(0x110);
      psVar2 = (streambuf *)std::ios::rdbuf();
      std::ostream::ostream(object_input,psVar2);
      anon_unknown.dwarf_49c04::
      Initialization_Helper<std::basic_ostream<char,_std::char_traits<char>_>_>::
      Initialization_Helper
                (&cout_Helper::helper,object_input,
                 (bool *)&::(anonymous_namespace)::cout_initialized);
      __cxa_atexit(anon_unknown.dwarf_49c04::
                   Initialization_Helper<std::basic_ostream<char,_std::char_traits<char>_>_>::
                   ~Initialization_Helper,&cout_Helper::helper,&__dso_handle);
      __cxa_guard_release(&cout_Helper()::helper);
    }
  }
  return cout_Helper::helper.object;
}

Assistant:

std::ostream& Nova::Log::cout_Helper()
{
    static Initialization_Helper<std::ostream> helper(new std::ostream(std::cout.rdbuf()),cout_initialized);
    return *helper.object;
}